

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st2013.hpp
# Opt level: O2

void bcl::st2013::
     generate_transition_matrix<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *tm)

{
  pointer pdVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var6;
  size_t i_2;
  long lVar7;
  size_t i;
  long lVar8;
  long *plVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  vector<double,_std::allocator<double>_> accum;
  allocator_type local_41;
  double local_40;
  _Vector_base<double,_std::allocator<double>_> local_38;
  value_type local_20;
  
  lVar11 = (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_20 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_38,lVar11 + 1,&local_20,&local_41);
  pdVar5 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = 0.0;
  for (; pdVar5 != (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    local_40 = local_40 + *pdVar5;
  }
  _Var6 = std::
          __max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ();
  dVar13 = *_Var6._M_current;
  *local_38._M_impl.super__Vector_impl_data._M_start = 0.0;
  pdVar1 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar12 = 0.0;
  for (lVar8 = 0; lVar11 != lVar8; lVar8 = lVar8 + 1) {
    dVar12 = dVar12 + pdVar1[lVar8] / local_40;
    local_38._M_impl.super__Vector_impl_data._M_start[lVar8 + 1] = dVar12;
  }
  pvVar2 = (tm->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (lVar8 = 0; lVar8 != lVar11; lVar8 = lVar8 + 1) {
    lVar7 = *(long *)&pvVar2[lVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    for (lVar10 = 0; lVar11 != lVar10; lVar10 = lVar10 + 1) {
      auVar17._0_8_ =
           local_38._M_impl.super__Vector_impl_data._M_start[lVar8 + 1] + dVar13 / local_40;
      dVar12 = local_38._M_impl.super__Vector_impl_data._M_start[lVar8] + dVar13 / local_40;
      auVar16._8_8_ = local_38._M_impl.super__Vector_impl_data._M_start[lVar10 + 1] + 1.0;
      auVar16._0_8_ = local_38._M_impl.super__Vector_impl_data._M_start[lVar10 + 1];
      auVar17._8_8_ = auVar17._0_8_;
      auVar17 = minpd(auVar16,auVar17);
      auVar14._8_8_ = local_38._M_impl.super__Vector_impl_data._M_start[lVar10] + 1.0;
      auVar14._0_8_ = local_38._M_impl.super__Vector_impl_data._M_start[lVar10];
      auVar15._8_8_ = dVar12;
      auVar15._0_8_ = dVar12;
      auVar15 = maxpd(auVar14,auVar15);
      auVar18._0_8_ = auVar17._0_8_ - auVar15._0_8_;
      auVar18._8_8_ = auVar17._8_8_ - auVar15._8_8_;
      auVar15 = maxpd(ZEXT816(0),auVar18);
      *(double *)(lVar7 + lVar10 * 8) = auVar15._8_8_ + auVar15._0_8_;
    }
  }
  lVar8 = 0;
  for (lVar7 = 0; lVar7 != lVar11; lVar7 = lVar7 + 1) {
    pvVar2 = (tm->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pdVar1 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    plVar9 = (long *)((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar8);
    for (lVar10 = lVar7; lVar11 != lVar10; lVar10 = lVar10 + 1) {
      lVar3 = *(long *)&pvVar2[lVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      lVar4 = *plVar9;
      dVar13 = (*(double *)(lVar3 + lVar10 * 8) + *(double *)(lVar4 + lVar7 * 8)) * 0.5;
      *(double *)(lVar3 + lVar10 * 8) = dVar13 / (pdVar1[lVar7] / local_40);
      *(double *)(lVar4 + lVar7 * 8) = dVar13 / (pdVar1[lVar10] / local_40);
      plVar9 = plVar9 + 3;
    }
    lVar8 = lVar8 + 0x18;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

static void generate_transition_matrix(VEC const& weights, MAT& tm) {
    using std::abs;
    std::size_t n = weights.size();
    std::vector<double> accum(n+1, 0);
    double sum = std::accumulate(weights.begin(), weights.end(), 0.0);
    double shift = *(std::max_element(weights.begin(), weights.end())) / sum;
    accum[0] = 0;
    for (std::size_t i = 0; i < n; ++i) accum[i+1] = accum[i] + weights[i] / sum;

    for (std::size_t i = 0; i < n; ++i) {
      for (std::size_t j = 0; j < n; ++j) {
        tm[i][j] = (std::max(std::min(accum[i+1] + shift, accum[j+1]) -
                             std::max(accum[i] + shift, accum[j]), 0.0) +
                    std::max(std::min(accum[i+1] + shift, accum[j+1] + 1) -
                             std::max(accum[i] + shift, accum[j] + 1), 0.0));
      }
    }
    for (std::size_t i = 0; i < n; ++i) {
      for (std::size_t j = i; j < n; ++j) {
        double t = (tm[i][j] + tm[j][i]) / 2;
        tm[i][j] = t / (weights[i] / sum);
        tm[j][i] = t / (weights[j] / sum);
      }
    }
  }